

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O2

void buffer_suite::format_vector(void)

{
  long local_60;
  vector<char,_std::allocator<char>_> result;
  undefined4 local_3c;
  variable data;
  
  data.storage.current = '\x01';
  data.storage.storage.__data[0] = '\x01';
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  trial::protocol::json::format<std::vector<char,std::allocator<char>>,std::allocator<char>>
            (&data,&result);
  local_60 = (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x2f,"void buffer_suite::format_vector()",&local_60,&local_3c);
  local_60._0_1_ = 0x74;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[0]","\'t\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x30,"void buffer_suite::format_vector()",
             result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,&local_60);
  local_60._0_1_ = 0x72;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[1]","\'r\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x31,"void buffer_suite::format_vector()",
             result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start + 1,&local_60);
  local_60._0_1_ = 0x75;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[2]","\'u\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x32,"void buffer_suite::format_vector()",
             result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start + 2,&local_60);
  local_60 = CONCAT71(local_60._1_7_,0x65);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[3]","\'e\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x33,"void buffer_suite::format_vector()",
             result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start + 3,&local_60);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&result.super__Vector_base<char,_std::allocator<char>_>);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void format_vector()
{
    variable data(true);
    std::vector<char> result;
    json::format(data, result);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 't');
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 'r');
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], 'u');
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 'e');
}